

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowChildOf(ImGuiWindow *window,ImGuiWindow *potential_parent)

{
  bool bVar1;
  
  if (window->RootWindow == potential_parent) {
    return true;
  }
  if (window != (ImGuiWindow *)0x0) {
    do {
      bVar1 = window == potential_parent;
      if (bVar1) {
        return bVar1;
      }
      window = window->ParentWindow;
    } while (window != (ImGuiWindow *)0x0);
    return bVar1;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowChildOf(ImGuiWindow* window, ImGuiWindow* potential_parent)
{
    if (window->RootWindow == potential_parent)
        return true;
    while (window != NULL)
    {
        if (window == potential_parent)
            return true;
        window = window->ParentWindow;
    }
    return false;
}